

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  uchar *puVar13;
  uchar *puVar14;
  long lVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  CImgArgumentException *this_00;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  byte *pbVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint x;
  int iVar32;
  int iVar33;
  uint uVar34;
  char *pcVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  ulong local_110;
  ulong local_108;
  ulong local_d8;
  ulong local_c8;
  CImg<unsigned_char> local_50;
  
  bVar16 = is_empty(this);
  if (((!bVar16) && (sprite->_data != (uchar *)0x0)) && (mask->_data != (uchar *)0x0)) {
    bVar16 = is_overlapped<unsigned_char>(this,sprite);
    if (bVar16) {
      operator+(&local_50,sprite);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,&local_50,mask,opacity,mask_max_value);
    }
    else {
      bVar16 = is_overlapped<unsigned_char>(this,mask);
      if (!bVar16) {
        uVar2 = mask->_width;
        if (uVar2 == sprite->_width) {
          uVar3 = mask->_height;
          if (uVar3 == sprite->_height) {
            uVar4 = mask->_depth;
            if (uVar4 == sprite->_depth) {
              uVar28 = 0;
              if (0 < x0) {
                uVar28 = x0;
              }
              uVar24 = 0;
              if (0 < y0) {
                uVar24 = y0;
              }
              uVar29 = 0;
              if (0 < z0) {
                uVar29 = z0;
              }
              uVar21 = 0;
              if (0 < c0) {
                uVar21 = c0;
              }
              x = uVar28 - x0;
              iVar32 = this->_width - (x0 + uVar2);
              if ((int)(x0 + uVar2) <= (int)this->_width) {
                iVar32 = 0;
              }
              iVar32 = iVar32 + (uVar2 - x);
              iVar33 = this->_height - (uVar3 + y0);
              if ((int)(uVar3 + y0) <= (int)this->_height) {
                iVar33 = 0;
              }
              iVar36 = this->_depth - (z0 + uVar4);
              if ((int)(z0 + uVar4) <= (int)this->_depth) {
                iVar36 = 0;
              }
              iVar40 = sprite->_spectrum + c0;
              iVar26 = this->_spectrum - iVar40;
              if (iVar40 <= (int)this->_spectrum) {
                iVar26 = 0;
              }
              if (iVar32 < 1) {
                return this;
              }
              uVar41 = uVar24 - y0;
              uVar34 = iVar33 + (uVar3 - uVar41);
              if ((int)uVar34 < 1) {
                return this;
              }
              uVar38 = uVar29 - z0;
              uVar37 = iVar36 + (uVar4 - uVar38);
              if ((int)uVar37 < 1) {
                return this;
              }
              uVar39 = uVar21 - c0;
              uVar27 = iVar26 + (sprite->_spectrum - uVar39);
              if ((int)uVar27 < 1) {
                return this;
              }
              uVar5 = mask->_spectrum;
              local_d8 = (ulong)uVar21;
              uVar21 = uVar39;
              for (uVar20 = 0; local_110 = (ulong)uVar21, uVar20 != uVar27; uVar20 = uVar20 + 1) {
                local_c8 = (ulong)uVar29;
                uVar17 = uVar38;
                for (uVar23 = 0; local_108 = (ulong)uVar17, uVar23 != uVar37; uVar23 = uVar23 + 1) {
                  uVar31 = (ulong)uVar24;
                  uVar30 = uVar41;
                  for (uVar22 = 0; uVar22 != uVar34; uVar22 = uVar22 + 1) {
                    uVar6 = this->_width;
                    uVar7 = this->_height;
                    uVar8 = this->_depth;
                    uVar9 = sprite->_width;
                    uVar10 = sprite->_height;
                    uVar11 = sprite->_depth;
                    puVar12 = mask->_data;
                    puVar13 = this->_data;
                    puVar14 = sprite->_data;
                    uVar18 = offset(mask,x,uVar41 + (int)uVar22,uVar38 + (int)uVar23,
                                    (int)uVar20 + uVar39);
                    pbVar25 = puVar12 + uVar18 % ((ulong)uVar4 * (ulong)uVar5 *
                                                 (ulong)uVar3 * (ulong)uVar2);
                    lVar15 = ((uVar8 * local_d8 + local_c8) * (ulong)uVar7 + uVar31) * (ulong)uVar6
                             + (ulong)uVar28;
                    for (lVar19 = 0; iVar32 != (int)lVar19; lVar19 = lVar19 + 1) {
                      bVar1 = *pbVar25;
                      pbVar25 = pbVar25 + 1;
                      fVar42 = (float)bVar1 * opacity;
                      fVar43 = 0.0;
                      if (0.0 <= fVar42) {
                        fVar43 = fVar42;
                      }
                      puVar13[lVar19 + lVar15] =
                           (uchar)(int)(((float)puVar14[lVar19 + ((uVar11 * local_110 + local_108) *
                                                                  (ulong)uVar10 + (ulong)uVar30) *
                                                                 (ulong)uVar9 + (ulong)x] *
                                         ABS(fVar42) +
                                        (float)puVar13[lVar19 + lVar15] * (mask_max_value - fVar43))
                                       / mask_max_value);
                    }
                    uVar31 = uVar31 + 1;
                    uVar30 = uVar30 + 1;
                  }
                  local_c8 = local_c8 + 1;
                  uVar17 = uVar17 + 1;
                }
                local_d8 = local_d8 + 1;
                uVar21 = uVar21 + 1;
              }
              return this;
            }
          }
        }
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
        pcVar35 = "non-";
        if (this->_is_shared != false) {
          pcVar35 = "";
        }
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar35,"unsigned char",(ulong)sprite->_width,
                   (ulong)sprite->_height,(ulong)sprite->_depth,(ulong)sprite->_spectrum,
                   sprite->_data,(ulong)mask->_width,(ulong)mask->_height,(ulong)mask->_depth,
                   (ulong)mask->_spectrum,mask->_data);
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
      }
      operator+(&local_50,mask);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,sprite,&local_50,opacity,mask_max_value);
    }
    ~CImg(&local_50);
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask)) return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have "
                                    "incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT msize = mask.size();

      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const ti *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              const tm *ptrm = mask._data + (mask.offset(sx0,sy0 + y,sz0 + z,sc0 + c)%msize);
              for (int x = 0; x<lx; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - std::max(mopacity,0.f);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
            }
      }
      return *this;
    }